

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool sx_strnequalnocase(char *a,char *b,int num)

{
  ulong uVar1;
  int var__b_1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int var__b;
  int var__a;
  bool bVar5;
  
  uVar2 = sx_strlen(a);
  uVar3 = sx_strlen(b);
  if (num <= (int)uVar2) {
    uVar2 = num;
  }
  if ((int)uVar3 < num) {
    num = uVar3;
  }
  if (uVar2 == num) {
    bVar5 = (int)uVar2 < 1;
    if ((0 < (int)uVar2) &&
       ((char)(((byte)(*a + 0xbfU) < 0x1a) * ' ' + *a) ==
        (char)(((byte)(*b + 0xbfU) < 0x1a) * ' ' + *b))) {
      uVar1 = 1;
      do {
        uVar4 = uVar1;
        if (uVar2 == uVar4) break;
        uVar1 = uVar4 + 1;
      } while ((char)(((byte)(a[uVar4] + 0xbfU) < 0x1a) * ' ' + a[uVar4]) ==
               (char)(((byte)(b[uVar4] + 0xbfU) < 0x1a) * ' ' + b[uVar4]));
      bVar5 = uVar2 <= uVar4;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool sx_strnequalnocase(const char* SX_RESTRICT a, const char* SX_RESTRICT b, int num)
{
    int _alen = sx_strlen(a);
    int _blen = sx_strlen(b);
    int alen = sx_min(num, _alen);
    int blen = sx_min(num, _blen);
    if (alen != blen)
        return false;

    for (int i = 0; i < alen; i++) {
        if (sx_tolowerchar(a[i]) != sx_tolowerchar(b[i]))
            return false;
    }
    return true;
}